

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O3

size_t ellipses::find_weakest_element
                 (vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *ellipses)

{
  long *plVar1;
  pointer pRVar2;
  pointer pRVar3;
  float *pfVar4;
  Size2f *pSVar5;
  const_iterator __begin0;
  pointer pPVar6;
  size_type __n;
  pointer pRVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  Point2f *pPVar11;
  long lVar12;
  size_t sVar13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var14;
  float fVar15;
  double dVar16;
  double dVar20;
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar25;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar26;
  vector<double,_std::allocator<double>_> distances;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bad_score;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> centers;
  vector<double,_std::allocator<double>_> ratios;
  vector<float,_std::allocator<float>_> angles;
  allocator_type local_91;
  vector<double,_std::allocator<double>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  vector<float,_std::allocator<float>_> local_30;
  
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  __n = ((long)pRVar3 - (long)pRVar2 >> 2) * -0x3333333333333333;
  if (pRVar3 != pRVar2) {
    pfVar4 = &(pRVar2->size).height;
    sVar13 = 0;
    do {
      if ((((pfVar4[-3] == 0.0) && (pfVar4[-2] == 0.0)) && (!NAN(pfVar4[-2]))) &&
         (((((Size2f *)(pfVar4 + -1))->width == 0.0 && (!NAN(((Size2f *)(pfVar4 + -1))->width))) &&
          ((*pfVar4 == 0.0 && (!NAN(*pfVar4))))))) {
        return sVar13;
      }
      sVar13 = sVar13 + 1;
      pfVar4 = pfVar4 + 5;
    } while (__n + (__n == 0) != sVar13);
  }
  local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_78,__n,(value_type_conflict1 *)&local_90,(allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (allocator_type *)&local_60);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&local_60,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (allocator_type *)&local_30);
  pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pPVar11 = local_60.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (pRVar7 = pRVar2; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    *pPVar11 = pRVar7->center;
    pPVar11 = pPVar11 + 1;
  }
  if (local_60.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_60.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fVar15 = 0.0;
    fVar19 = 0.0;
  }
  else {
    lVar12 = (long)local_60.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    auVar24._8_4_ =
         (int)((long)local_60.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_60.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 0x23);
    auVar24._0_8_ = lVar12;
    auVar24._12_4_ = 0x45300000;
    dVar16 = (double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0;
    dVar20 = auVar24._8_8_ - 1.9342813113834067e+25;
    auVar17._0_8_ = dVar20 + dVar16;
    auVar17._8_8_ = dVar20 + dVar16;
    dVar16 = 0.0;
    dVar20 = 0.0;
    pPVar6 = local_60.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      auVar23._0_8_ = (double)(*pPVar6).x;
      auVar23._8_8_ = (double)(*pPVar6).y;
      auVar24 = divpd(auVar23,auVar17);
      dVar16 = dVar16 + auVar24._0_8_;
      dVar20 = dVar20 + auVar24._8_8_;
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != local_60.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    fVar15 = (float)(int)dVar16;
    fVar19 = (float)(int)dVar20;
  }
  if (pRVar2 != pRVar3) {
    lVar12 = ((long)pRVar3 - (long)pRVar2 >> 2) * -0x3333333333333333;
    pfVar4 = &(pRVar2->center).y;
    lVar8 = 0;
    do {
      fVar22 = fVar15 - ((Point2f *)(pfVar4 + -1))->x;
      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = (double)SQRT(fVar22 * fVar22 + (fVar19 - *pfVar4) * (fVar19 - *pfVar4));
      lVar8 = lVar8 + 1;
      pfVar4 = pfVar4 + 5;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar8);
  }
  pVar25 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 3);
  if (20.0 < *pVar25.second._M_current._M_current) {
    plVar1 = (long *)((long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                     ((long)pVar25.second._M_current._M_current -
                     (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start));
    *plVar1 = *plVar1 + 1;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_30,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (allocator_type *)&local_48);
  pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pfVar4 = local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pRVar7 = pRVar2; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    *pfVar4 = pRVar7->angle;
    pfVar4 = pfVar4 + 1;
  }
  auVar18 = ZEXT816(0);
  for (pfVar4 = local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar4 != local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar4 = pfVar4 + 1) {
    auVar18._0_4_ = auVar18._0_4_ + *pfVar4;
  }
  if (pRVar2 != pRVar3) {
    lVar12 = ((long)pRVar3 - (long)pRVar2 >> 2) * -0x3333333333333333;
    pfVar4 = &pRVar2->angle;
    lVar8 = 0;
    do {
      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] =
           (double)ABS(auVar18._0_4_ /
                       (float)(ulong)((long)local_30.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_30.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 2) - *pfVar4
                      );
      lVar8 = lVar8 + 1;
      pfVar4 = pfVar4 + 5;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar8);
  }
  pVar25 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 3);
  plVar1 = (long *)((long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   ((long)pVar25.second._M_current._M_current -
                   (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start));
  *plVar1 = *plVar1 + 1;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             ((long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,&local_91
            );
  pRVar3 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  pRVar2 = (ellipses->super__Vector_base<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pdVar9 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pRVar7 = pRVar2; pRVar7 != pRVar3; pRVar7 = pRVar7 + 1) {
    *pdVar9 = (double)(pRVar7->size).width / (double)(pRVar7->size).height;
    pdVar9 = pdVar9 + 1;
  }
  dVar16 = 0.0;
  for (pdVar9 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
    dVar16 = dVar16 + *pdVar9;
  }
  if (pRVar2 != pRVar3) {
    lVar8 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    auVar21._8_4_ =
         (int)((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 0x23);
    auVar21._0_8_ = lVar8;
    auVar21._12_4_ = 0x45300000;
    lVar12 = ((long)pRVar3 - (long)pRVar2 >> 2) * -0x3333333333333333;
    pSVar5 = &pRVar2->size;
    lVar10 = 0;
    do {
      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] =
           ABS(dVar16 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) -
               (double)(*pSVar5).width / (double)(*pSVar5).height);
      lVar10 = lVar10 + 1;
      pSVar5 = (Size2f *)&pSVar5[2].height;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar10);
  }
  pVar25 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 3);
  if (0.01 < *pVar25.second._M_current._M_current) {
    plVar1 = (long *)((long)local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                     ((long)pVar25.second._M_current._M_current -
                     (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start));
    *plVar1 = *plVar1 + 1;
  }
  pVar26 = std::
           __minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                     (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  _Var14._M_current = pVar26.second._M_current._M_current;
  if (*pVar26.second._M_current._M_current < 2) {
    _Var14._M_current =
         local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  lVar12 = (long)_Var14._M_current -
           (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (Point2f *)0x0) {
    operator_delete(local_60.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar12 >> 3;
}

Assistant:

std::size_t find_weakest_element(const std::vector<cv::RotatedRect>& ellipses)
{
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(ellipses[i].center == cv::Point2f() && ellipses[i].size == cv::Size2f())
        {
            return i;
        }
    }

    std::vector<std::size_t> bad_score(ellipses.size(), 0);
    std::vector<double> distances(ellipses.size());

    std::vector<cv::Point2f> centers(ellipses.size());
    std::transform(
        ellipses.begin(), ellipses.end(), centers.begin(), [](const cv::RotatedRect& e) { return e.center; });
    auto mcenter = center_of_mass(centers);
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = euclideanDistance(
            cv::Point2f(static_cast<float>(mcenter.x), static_cast<float>(mcenter.y)), ellipses[i].center);
    }
    auto max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 20)
        bad_score[std::distance(distances.begin(), max)]++;

    std::vector<float> angles(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), angles.begin(), [](const cv::RotatedRect& e) { return e.angle; });
    auto mangles = std::accumulate(angles.begin(), angles.end(), 0.f) / angles.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        distances[i] = std::abs(mangles - ellipses[i].angle);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    bad_score[std::distance(distances.begin(), max)]++;

    std::vector<double> ratios(ellipses.size());
    std::transform(ellipses.begin(), ellipses.end(), ratios.begin(), [](const cv::RotatedRect& e) {
#if CV_MAJOR_VERSION < 3
        return e.size.width / static_cast<double>(e.size.height);
#else //! CV_MAJOR_VERSION > 3
            return e.size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3
    });
    auto mratios = std::accumulate(ratios.begin(), ratios.end(), 0.) / ratios.size();
    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
#if CV_MAJOR_VERSION < 3
        double aspect = ellipses[i].size.width / static_cast<double>(ellipses[i].size.height);
#else //! CV_MAJOR_VERSION > 3
        double aspect = ellipses[i].size.aspectRatio();
#endif // CV_MAJOR_VERSION <> 3

        distances[i] = std::abs(mratios - aspect);
    }
    max = std::minmax_element(distances.begin(), distances.begin() + 3).second;
    if(*max > 0.01)
        bad_score[std::distance(distances.begin(), max)]++;

    auto max_bad = std::minmax_element(bad_score.begin(), bad_score.end()).second;
    if(*max_bad > 1)
        return std::distance(bad_score.begin(), max_bad);
    return bad_score.size();
}